

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O3

Horizon * __thiscall
icu_63::CalendarAstronomer::eclipticToHorizon
          (CalendarAstronomer *this,Horizon *result,double eclipLong)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Equatorial local_28;
  
  local_28.ascension = 0.0;
  local_28.declination = 0.0;
  eclipticToEquatorial(this,&local_28,eclipLong,0.0);
  dVar1 = getGreenwichSidereal(this);
  dVar1 = dVar1 + this->fGmtOffset / 3600000.0;
  dVar2 = uprv_floor_63(dVar1 / 24.0);
  dVar1 = ((dVar2 * -24.0 + dVar1) * 3.141592653589793) / 12.0 - local_28.ascension;
  dVar2 = sin(dVar1);
  dVar1 = cos(dVar1);
  dVar3 = sin(local_28.declination);
  dVar4 = cos(local_28.declination);
  dVar5 = sin(this->fLatitude);
  dVar6 = cos(this->fLatitude);
  dVar1 = asin(dVar3 * dVar5 + dVar4 * dVar6 * dVar1);
  dVar7 = sin(dVar1);
  dVar2 = atan2(-dVar4 * dVar6 * dVar2,dVar3 - dVar7 * dVar5);
  *(double *)result = dVar2;
  *(double *)(result + 8) = dVar1;
  return result;
}

Assistant:

CalendarAstronomer::Horizon& CalendarAstronomer::eclipticToHorizon(CalendarAstronomer::Horizon& result, double eclipLong)
{
    Equatorial equatorial;
    eclipticToEquatorial(equatorial, eclipLong);

    double H = getLocalSidereal()*CalendarAstronomer::PI/12 - equatorial.ascension;     // Hour-angle

    double sinH = ::sin(H);
    double cosH = cos(H);
    double sinD = ::sin(equatorial.declination);
    double cosD = cos(equatorial.declination);
    double sinL = ::sin(fLatitude);
    double cosL = cos(fLatitude);

    double altitude = asin(sinD*sinL + cosD*cosL*cosH);
    double azimuth  = atan2(-cosD*cosL*sinH, sinD - sinL * ::sin(altitude));

    result.set(azimuth, altitude);
    return result;
}